

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O1

bool __thiscall
Refal2::COperationsExecuter::matchLeftDuplicateSaveToTable_WV
          (COperationsExecuter *this,TTableIndex origin)

{
  int iVar1;
  CUnitNode *pCVar2;
  CUnitNode *pCVar3;
  CNode<Refal2::CUnit> *this_00;
  bool bVar4;
  CUnitNode *pCVar5;
  bool bVar6;
  
  pCVar2 = this->left;
  pCVar5 = this->table[origin];
  pCVar3 = this->table[(long)origin + 1];
  while( true ) {
    bVar6 = pCVar5 == pCVar3->next;
    if (bVar6) {
      iVar1 = this->tableTop;
      if (iVar1 < (((this->super_CExecutionContext).Program.
                    super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CCompilationContext).maxTableSize) {
        pCVar5 = this->left;
        this->table[iVar1] = pCVar2->next;
        this->tableTop = iVar1 + 1;
        if (iVar1 + 1 <
            (((this->super_CExecutionContext).Program.
              super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_CCompilationContext).maxTableSize) {
          this->table[(long)iVar1 + 1] = pCVar5;
          this->tableTop = iVar1 + 2;
          return bVar6;
        }
      }
      __assert_fail("tableTop < Program->MaxTableSize()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                    ,0xef,"void Refal2::COperationsExecuter::saveToTable(CUnitNode *const)");
    }
    this_00 = this->left->next;
    this->left = this_00;
    if (this_00 == (CNode<Refal2::CUnit> *)0x0) {
      __assert_fail("left != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/OperationsExecuter.h"
                    ,0x104,"bool Refal2::COperationsExecuter::shiftLeft()");
    }
    if (this_00 == this->right) break;
    bVar4 = CUnit::IsEqualWith(&this_00->super_CUnit,&pCVar5->super_CUnit);
    if (!bVar4) {
      return bVar6;
    }
    pCVar5 = pCVar5->next;
  }
  return bVar6;
}

Assistant:

inline bool COperationsExecuter::matchLeftDuplicateSaveToTable_WV(
	const TTableIndex origin )
{
	CUnitNode* originLeft = table[origin];
	CUnitNode* const originRight = table[origin + 1];
	CUnitNode* valueBegin = left;
	for( ; originLeft != originRight->Next();
		originLeft = originLeft->Next() )
	{
		if( !shiftLeft() || !left->IsEqualWith( *originLeft ) ) {
			return false;
		}
	}
	saveToTable( valueBegin->Next(), left );
	return true;
}